

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

ssize_t __thiscall Image::write(Image *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  string path;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::to_string(&local_78,*__buf);
  std::operator+(&local_58,"../results/",&local_78);
  std::operator+(&local_38,&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_register_00000034,__fd));
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  local_58.field_2._M_allocated_capacity = 0;
  local_58._M_dataplus._M_p._0_4_ = 0x1010000;
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_58._M_string_length = __n;
  cv::imwrite((string *)&local_38,(_InputArray *)&local_58,(vector *)&local_78);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_78);
  sVar1 = std::__cxx11::string::~string((string *)&local_38);
  return sVar1;
}

Assistant:

void Image::write(std::string filename,  const int &iteration, const cv::Mat& image) {
    std::string path = "../results/"+ std::to_string(iteration)  + filename;
    cv::imwrite(path, image);
}